

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O0

QSize __thiscall QIcon::actualSize(QIcon *this,QWindow *window,QSize *size,Mode mode,State state)

{
  undefined4 in_ECX;
  QSize *in_RDX;
  QSize *in_RSI;
  QSize *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qreal c;
  qreal devicePixelRatio;
  QSize actualSize;
  QWindow *in_stack_ffffffffffffffa0;
  long *plVar1;
  QSize *pQVar2;
  QSize local_20;
  undefined1 *local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == (QSize)0x0) {
    QSize::QSize((QSize *)in_stack_ffffffffffffffa0);
  }
  else {
    pQVar2 = in_RDI;
    if (in_RSI == (QSize *)0x0) {
      QCoreApplication::instance();
      c = QGuiApplication::devicePixelRatio((QGuiApplication *)in_RDI);
    }
    else {
      c = QWindow::devicePixelRatio(in_stack_ffffffffffffffa0);
    }
    if (1.0 < c) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      plVar1 = *(long **)*in_RDI;
      local_20 = ::operator*(in_RDI,c);
      local_18 = (undefined1 *)(**(code **)(*plVar1 + 0x18))(plVar1,&local_20,in_ECX,in_R8D);
      QIconPrivate::pixmapDevicePixelRatio((qreal)pQVar2,in_RSI,in_RDX);
      local_10 = operator/(in_RDI,c);
    }
    else {
      local_10 = (QSize)(**(code **)(**(long **)*in_RDI + 0x18))
                                  (*(long **)*in_RDI,in_RDX,in_ECX,in_R8D);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QIcon::actualSize(QWindow *window, const QSize &size, Mode mode, State state) const
{
    if (!d)
        return QSize();

    qreal devicePixelRatio = window ? window->devicePixelRatio() : qApp->devicePixelRatio();

    // Handle the simple normal-dpi case:
    if (!(devicePixelRatio > 1.0))
        return d->engine->actualSize(size, mode, state);

    QSize actualSize = d->engine->actualSize(size * devicePixelRatio, mode, state);
    return actualSize / d->pixmapDevicePixelRatio(devicePixelRatio, size, actualSize);
}